

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.h
# Opt level: O1

void __thiscall bloaty::RollupOutput::SetDisassembly(RollupOutput *this,string_view disassembly)

{
  long *local_38 [2];
  long local_28 [2];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,disassembly._M_str,disassembly._M_str + disassembly._M_len);
  std::__cxx11::string::operator=((string *)&this->disassembly_,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void SetDisassembly(std::string_view disassembly) {
    disassembly_ = std::string(disassembly);
  }